

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O2

string * google::protobuf::util::anon_unknown_0::
         GetTypeUrl<proto2_unittest::TestAllTypes_NestedMessage>(void)

{
  char *pcVar1;
  Descriptor *pDVar2;
  char *in_RCX;
  _anonymous_namespace_ *this;
  string *in_RDI;
  string_view full_name;
  
  pDVar2 = proto2_unittest::TestAllTypes_NestedMessage::GetDescriptor();
  pcVar1 = (pDVar2->all_names_).payload_;
  this = (_anonymous_namespace_ *)(ulong)*(ushort *)(pcVar1 + 2);
  full_name._M_len = pcVar1 + ~(ulong)this;
  full_name._M_str = in_RCX;
  util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_(in_RDI,this,full_name);
  return in_RDI;
}

Assistant:

std::string GetTypeUrl() {
  return GetTypeUrl(T::descriptor()->full_name());
}